

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

int scroll_sub_menu_set_old_owner_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *list_value;
  Am_Object scroll_menu_widget;
  Am_Value_List parts;
  Am_Object local_30;
  Am_Value_List local_28;
  
  iVar2 = 0;
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    list_value = Am_Object::Get(self,0x82,0);
    Am_Value_List::Am_Value_List(&local_28,list_value);
    iVar2 = set_parts_list_commands_old_owner(&local_28,&local_30);
    Am_Value_List::~Am_Value_List(&local_28);
  }
  Am_Object::~Am_Object(&local_30);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, scroll_sub_menu_set_old_owner)
{
  Am_Object scroll_menu_widget = self.Get_Owner();
  int ret = 0;
  if (scroll_menu_widget.Valid()) {
    Am_Value_List parts = self.Get(Am_GRAPHICAL_PARTS);
    ret = set_parts_list_commands_old_owner(parts, scroll_menu_widget);
  }
  return ret;
}